

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::ConstantDerivateCaseInstance::verify
          (ConstantDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  float fVar1;
  DerivateCaseValues *pDVar2;
  int i;
  bool bVar3;
  undefined7 extraout_var;
  long lVar4;
  float fVar5;
  float local_58 [4];
  Vec4 threshold;
  Vec4 reference;
  float local_28 [4];
  
  reference.m_data[0] = 0.0;
  reference.m_data[1] = 0.0;
  reference.m_data[2] = 0.0;
  reference.m_data[3] = 0.0;
  TriangleDerivateCaseInstance::getSurfaceThreshold(&this->super_TriangleDerivateCaseInstance);
  pDVar2 = (this->super_TriangleDerivateCaseInstance).m_values;
  scale = &pDVar2->derivScale;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = scale->m_data[lVar4];
    fVar5 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar5 = fVar1;
    }
    local_58[lVar4] = fVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  threshold.m_data[0] = 0.0;
  threshold.m_data[1] = 0.0;
  threshold.m_data[2] = 0.0;
  threshold.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    threshold.m_data[lVar4] = local_28[lVar4] / local_58[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  bVar3 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                      super_TestInstance.m_context)->m_testCtx->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,&reference
                     ,&threshold,scale,&pDVar2->derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar3);
}

Assistant:

bool ConstantDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								  reference, threshold, m_values.derivScale, m_values.derivBias);
}